

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

CaseGenerateSyntax * __thiscall
slang::parsing::Parser::parseCaseGenerateConstruct(Parser *this,AttrList attributes)

{
  Token closeParen;
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  SourceLocation SVar4;
  Diagnostic *this_00;
  SourceLocation SVar5;
  MemberSyntax *pMVar6;
  DefaultCaseItemSyntax *pDVar7;
  ExpressionSyntax *pEVar8;
  undefined4 extraout_var;
  StandardCaseItemSyntax *pSVar9;
  undefined4 extraout_var_00;
  CaseGenerateSyntax *pCVar10;
  ulong uVar11;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  Token TVar12;
  Token TVar13;
  Token openParen;
  Token colon;
  Token keyword;
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> itemBuffer;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_218;
  Token local_208;
  SyntaxFactory *local_1f8;
  ulong local_1f0;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1e8;
  ulong local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c0;
  Token local_1b0;
  ExpressionSyntax *local_1a0;
  Info *local_198;
  undefined8 local_190;
  Info *local_188;
  undefined8 local_180;
  pointer local_178;
  Info *local_170;
  Token local_168;
  undefined8 local_158;
  Info *pIStack_150;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> local_148 [2];
  undefined1 local_108 [24];
  undefined1 auStack_f0 [24];
  __extent_storage<18446744073709551615UL> local_d8;
  
  local_170 = (Info *)attributes._M_extent._M_extent_value;
  local_178 = attributes._M_ptr;
  local_1b0 = ParserBase::consume(&this->super_ParserBase);
  TVar12 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_198 = TVar12.info;
  local_190 = TVar12._0_8_;
  local_1a0 = parseExpression(this);
  TVar12 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 5;
  local_1f8 = &this->factory;
  SVar5 = (SourceLocation)0x0;
  local_1f0 = 0;
  do {
    local_188 = TVar12.info;
    local_180 = TVar12._0_8_;
    TVar12 = ParserBase::peek(&this->super_ParserBase);
    TVar2 = TVar12.kind;
    uVar11 = (ulong)TVar2;
    if (TVar2 == DefaultKeyword) {
      if ((((ulong)SVar5 & 0xfffffff) != 0) && ((local_1f0 & 1) == 0)) {
        local_108._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        SVar4 = Token::location((Token *)local_108);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x810005,SVar4);
        local_1f0 = CONCAT71((int7)(uVar11 >> 8),1);
        Diagnostic::addNote(this_00,(DiagCode)0xa0001,SVar5);
      }
      local_108._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar5 = Token::location((Token *)local_108);
      TVar12 = ParserBase::consume(&this->super_ParserBase);
      TVar13 = ParserBase::consumeIf(&this->super_ParserBase,Colon);
      pMVar6 = parseGenerateBlock(this);
      pDVar7 = slang::syntax::SyntaxFactory::defaultCaseItem
                         (local_1f8,TVar12,TVar13,&pMVar6->super_SyntaxNode);
      local_108._0_8_ = pDVar7;
      SmallVectorBase<slang::syntax::CaseItemSyntax*>::emplace_back<slang::syntax::CaseItemSyntax*>
                ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_148,
                 (CaseItemSyntax **)local_108);
LAB_003c23c8:
      bVar1 = true;
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar2);
      if (bVar1) {
        Token::Token(&local_208);
        local_108._8_8_ = 0;
        local_108._0_8_ = auStack_f0;
        local_108._16_8_ = (SyntaxNode *)0x8;
        local_218 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(local_218.kind);
        if (bVar1) {
          bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
          if (!bVar1) {
            SVar4 = Token::location(&local_218);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar4);
          }
          local_208 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_003c2185:
          src = local_208.info;
        }
        else {
          bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_218.kind);
          if (bVar1) {
            do {
              pEVar8 = parseExpression(this);
              local_1e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar8;
              local_1d8 = CONCAT71(local_1d8._1_7_,1);
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                         (TokenOrSyntax *)&local_1e8._M_first);
              TVar12 = ParserBase::peek(&this->super_ParserBase);
              TVar2 = TVar12.kind;
              bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar2);
              iVar3 = 3;
              src = extraout_RDX;
              if (TVar2 != EndOfFile && !bVar1) {
                if (TVar2 != Comma) {
                  ParserBase::expect(&this->super_ParserBase,Comma);
                  do {
                    bVar1 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                      (&this->super_ParserBase,(DiagCode)0x10001,false);
                    if (!bVar1) {
                      local_208 = ParserBase::expect(&this->super_ParserBase,Colon);
                      src = local_208.info;
                      iVar3 = 1;
                      goto LAB_003c22e2;
                    }
                    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
                  } while (!bVar1);
                }
                local_1e8._M_first._M_storage =
                     (_Uninitialized<slang::parsing::Token,_true>)
                     ParserBase::expect(&this->super_ParserBase,Comma);
                local_1d8 = local_1d8 & 0xffffffffffffff00;
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                           (TokenOrSyntax *)&local_1e8._M_first);
                TVar12 = ParserBase::peek(&this->super_ParserBase);
                TVar2 = TVar12.kind;
                bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar2);
                if (TVar2 == EndOfFile || bVar1) {
                  ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                  src = extraout_RDX_01;
                }
                else {
                  src = extraout_RDX_00;
                  if ((local_218.kind == TVar2) && (local_218.info == TVar12.info)) {
                    bVar1 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                      (&this->super_ParserBase,(DiagCode)0x10001,true);
                    src = extraout_RDX_02;
                    if (!bVar1) goto LAB_003c22e2;
                  }
                  iVar3 = 0;
                  local_218 = TVar12;
                }
              }
LAB_003c22e2:
            } while (iVar3 == 0);
            if (iVar3 == 3) {
              local_208 = ParserBase::expect(&this->super_ParserBase,Colon);
              goto LAB_003c2185;
            }
          }
          else {
            ParserBase::reportMissingList
                      (&this->super_ParserBase,local_218,Colon,&local_208,(DiagCode)0x10001);
            src = extraout_RDX_03;
          }
        }
        iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
        TVar12 = local_208;
        local_1c0 = CONCAT44(extraout_var,iVar3);
        local_1e8._8_4_ = 3;
        local_1d8 = 0;
        uStack_1d0 = 0;
        local_1e8._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005e62d0;
        pMVar6 = parseGenerateBlock(this);
        pSVar9 = slang::syntax::SyntaxFactory::standardCaseItem
                           (local_1f8,
                            (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                            &local_1e8._M_first,TVar12,&pMVar6->super_SyntaxNode);
        local_218._0_8_ = pSVar9;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_148,
                   (CaseItemSyntax **)&local_218);
        if ((pointer)local_108._0_8_ != (pointer)auStack_f0) {
          operator_delete((void *)local_108._0_8_);
        }
        goto LAB_003c23c8;
      }
      bVar1 = false;
    }
    TVar12.info = local_188;
    TVar12.kind = (undefined2)local_180;
    TVar12._2_1_ = local_180._2_1_;
    TVar12.numFlags.raw = local_180._3_1_;
    TVar12.rawLen = local_180._4_4_;
    if (!bVar1) {
      if (local_148[0].len == 0) {
        SVar5 = Token::location(&local_1b0);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x40005,SVar5);
      }
      TVar13 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
      TVar12 = local_1b0;
      local_108._8_4_ = 1;
      local_108._16_8_ = (SyntaxNode *)0x0;
      auStack_f0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
      auStack_f0._8_8_ = local_170;
      auStack_f0._16_8_ = local_178;
      local_d8._M_extent_value = (size_t)local_170;
      local_108._0_8_ = &PTR_getChild_005e5c48;
      local_158 = local_180;
      pIStack_150 = local_188;
      iVar3 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy
                        (local_148,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                         (EVP_PKEY_CTX *)TVar13.info);
      local_1c0 = CONCAT44(extraout_var_00,iVar3);
      local_1e8._8_4_ = 1;
      local_1d8 = 0;
      uStack_1d0 = 0;
      local_1e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005e60e0
      ;
      closeParen.info = pIStack_150;
      closeParen.kind = (undefined2)local_158;
      closeParen._2_1_ = local_158._2_1_;
      closeParen.numFlags.raw = local_158._3_1_;
      closeParen.rawLen = local_158._4_4_;
      openParen.info = local_198;
      openParen.kind = (undefined2)local_190;
      openParen._2_1_ = local_190._2_1_;
      openParen.numFlags.raw = local_190._3_1_;
      openParen.rawLen = local_190._4_4_;
      local_168 = TVar13;
      pCVar10 = slang::syntax::SyntaxFactory::caseGenerate
                          (local_1f8,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_108
                           ,TVar12,openParen,local_1a0,closeParen,
                           (SyntaxList<slang::syntax::CaseItemSyntax> *)&local_1e8._M_first,TVar13);
      if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
        operator_delete(local_148[0].data_);
      }
      return pCVar10;
    }
  } while( true );
}

Assistant:

CaseGenerateSyntax& Parser::parseCaseGenerateConstruct(AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& condition = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<CaseItemSyntax*> itemBuffer;
    SourceLocation lastDefault;
    bool errored = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::DefaultKeyword) {
            if (lastDefault && !errored) {
                auto& diag = addDiag(diag::MultipleGenerateDefaultCases, peek().location());
                diag.addNote(diag::NotePreviousDefinition, lastDefault);
                errored = true;
            }

            lastDefault = peek().location();

            auto def = consume();
            auto colon = consumeIf(TokenKind::Colon);
            itemBuffer.push_back(&factory.defaultCaseItem(def, colon, parseGenerateBlock()));
        }
        else if (isPossibleExpression(kind)) {
            Token colon;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpression(); });
            itemBuffer.push_back(
                &factory.standardCaseItem(buffer.copy(alloc), colon, parseGenerateBlock()));
        }
        else {
            break;
        }
    }

    if (itemBuffer.empty())
        addDiag(diag::CaseGenerateEmpty, keyword.location());

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.caseGenerate(attributes, keyword, openParen, condition, closeParen,
                                itemBuffer.copy(alloc), endcase);
}